

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCollectObjs_rec(Gia_Man_t *p,int iObjId,Vec_Int_t *vObjs,int Limit)

{
  int iVar1;
  Gia_Obj_t *pObj;
  
  if ((vObjs->nSize != Limit) && (iVar1 = Gia_ObjIsTravIdCurrentId(p,iObjId), iVar1 == 0)) {
    Gia_ObjSetTravIdCurrentId(p,iObjId);
    pObj = Gia_ManObj(p,iObjId);
    if ((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) {
LAB_00217992:
      Vec_IntPush(vObjs,iObjId);
      return;
    }
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    Gia_ManCollectObjs_rec(p,iVar1,vObjs,Limit);
    if (vObjs->nSize != Limit) {
      iVar1 = Gia_ObjFaninId1p(p,pObj);
      Gia_ManCollectObjs_rec(p,iVar1,vObjs,Limit);
      if (vObjs->nSize != Limit) goto LAB_00217992;
    }
  }
  return;
}

Assistant:

void Gia_ManCollectObjs_rec( Gia_Man_t * p, int iObjId, Vec_Int_t * vObjs, int Limit )
{
    Gia_Obj_t * pObj;
    if ( Vec_IntSize(vObjs) == Limit )
        return;
    if ( Gia_ObjIsTravIdCurrentId(p, iObjId) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObjId);
    pObj = Gia_ManObj( p, iObjId );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId0p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId1p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
    }
    Vec_IntPush( vObjs, iObjId );
}